

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_NUMBER::OAddAndAssign(_Type_NUMBER *this,Variable *obj1,Variable *obj2)

{
  bool bVar1;
  Object *pOVar2;
  Type *pTVar3;
  Number *pNVar4;
  Number *pNVar5;
  Variable *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar6;
  Variable VVar7;
  undefined1 local_68 [48];
  undefined1 local_38 [8];
  Variable tmp;
  Variable *obj2_local;
  Variable *obj1_local;
  _Type_NUMBER *this_local;
  
  tmp.nb_ref = (uint *)in_RCX;
  pOVar2 = Variable::operator->(in_RCX);
  pTVar3 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(pTVar3,(Type *)obj1);
  if (bVar1) {
    Variable::Convert((Variable *)local_38,(Type *)tmp.nb_ref);
    pOVar2 = Variable::operator->((Variable *)local_38);
    pTVar3 = Object::GetType(pOVar2);
    bVar1 = Type::operator!=(pTVar3,(Type *)obj1);
    if (bVar1) {
      pOVar2 = Variable::operator->(obj2);
      Memory::Create((Memory *)local_68,(Type *)pOVar2->memory);
      Variable::operator=((Variable *)(local_68 + 0x10),obj2);
      Variable::~Variable((Variable *)(local_68 + 0x10));
      Variable::~Variable((Variable *)local_68);
      Variable::Variable((Variable *)this,obj2);
    }
    else {
      pOVar2 = Variable::operator->((Variable *)local_38);
      pNVar4 = Object::GetData<LiteScript::Number>(pOVar2);
      pOVar2 = Variable::operator->(obj2);
      pNVar5 = Object::GetData<LiteScript::Number>(pOVar2);
      Number::operator+=(pNVar5,pNVar4);
      Variable::Variable((Variable *)this,obj2);
    }
    Variable::~Variable((Variable *)local_38);
    puVar6 = extraout_RDX;
  }
  else {
    pOVar2 = Variable::operator->((Variable *)tmp.nb_ref);
    pNVar4 = Object::GetData<LiteScript::Number>(pOVar2);
    pOVar2 = Variable::operator->(obj2);
    pNVar5 = Object::GetData<LiteScript::Number>(pOVar2);
    Number::operator+=(pNVar5,pNVar4);
    Variable::Variable((Variable *)this,obj2);
    puVar6 = extraout_RDX_00;
  }
  VVar7.nb_ref = puVar6;
  VVar7.obj = (Object *)this;
  return VVar7;
}

Assistant:

LiteScript::Variable LiteScript::_Type_NUMBER::OAddAndAssign(LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    if (obj2->GetType() != *this) {
        Variable tmp = obj2.Convert(*this);
        if (tmp->GetType() != *this) {
            obj1 = obj1->memory.Create(Type::NIL);
            return obj1;
        }
        obj1->GetData<Number>() += tmp->GetData<Number>();
        return obj1;
    }
    obj1->GetData<Number>() += obj2->GetData<Number>();
    return obj1;
}